

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O3

void test_2d_dynamic<0ul,0ul,30ul,30ul>(void)

{
  long lVar1;
  int j;
  long lVar2;
  int *t;
  int j_1;
  value_type true_idx;
  vector<int,_std::allocator<int>_> data;
  unsigned_long local_60;
  int *local_58;
  unsigned_long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_60 = CONCAT71(local_60._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x76,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",(bool *)&local_48
             ,(bool *)&local_60);
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_60._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x78,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)&local_48,(int *)&local_60);
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_60 = CONCAT44(local_60._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x79,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)&local_48,(int *)&local_60);
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x384;
  local_60 = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x7b,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)&local_48,&local_60);
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x384;
  local_60 = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x7c,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)&local_48,&local_60);
  local_60 = CONCAT44(local_60._4_4_,0x2a);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,900,(value_type_conflict1 *)&local_60,(allocator_type *)&local_50);
  lVar2 = 0;
  local_58 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  do {
    lVar1 = 0;
    do {
      local_60 = lVar1 + lVar2;
      local_50 = local_60;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x8a,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",&local_50,
                 &local_60);
      lVar1 = lVar1 + 0x1e;
    } while (lVar1 != 900);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x1e);
  lVar2 = 0;
  t = local_58;
  do {
    lVar1 = 0;
    local_58 = t;
    do {
      local_60 = lVar2 + lVar1;
      local_50 = local_60;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0xa9,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",&local_50,
                 &local_60);
      local_50 = CONCAT44(local_50._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0xc0,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",t,
                 (int *)&local_50);
      lVar1 = lVar1 + 0x1e;
      t = t + 0x1e;
    } while (lVar1 != 900);
    lVar2 = lVar2 + 1;
    t = local_58 + 1;
  } while (lVar2 != 0x1e);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_2d_dynamic()
{ // {{{
    layout_mapping_right<
        dimensions<dyn, dyn>, dimensions<1, 1>, dimensions<dyn, dyn>
    > const l{{X, Y}, {}, {N, M}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    // Initialize all elements to 42.
    std::vector<int> data(
        (l[0] + l.padding()[0]) * (l[1] + l.padding()[1]), 42
    );
    int* dptr = data.data();

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}